

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d.cpp
# Opt level: O0

RasterFormatInfo * rw::d3d::findFormatInfoD3D(uint32 d3dformat)

{
  int local_18;
  int i;
  uint32 d3dformat_local;
  
  local_18 = 0;
  while( true ) {
    if (0x2b < local_18) {
      return &findFormatInfoD3D::fake;
    }
    if (*(uint32 *)(formatInfoFull + (long)local_18 * 0x10) == d3dformat) break;
    local_18 = local_18 + 1;
  }
  return (RasterFormatInfo *)(formatInfoFull + (long)local_18 * 0x10);
}

Assistant:

RasterFormatInfo*
findFormatInfoD3D(uint32 d3dformat)
{
	static RasterFormatInfo fake = { 0, 0, 0, 0 };
	int i;
	for(i = 0; i < (int)nelem(formatInfoFull); i++)
		if(formatInfoFull[i].d3dformat == d3dformat)
			return &formatInfoFull[i];
	return &fake;
}